

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void DestroyCVarsFlagged(DWORD flags)

{
  FBaseCVar *pFVar1;
  FBaseCVar *pFVar2;
  
  pFVar1 = CVars;
  while (pFVar2 = pFVar1, pFVar2 != (FBaseCVar *)0x0) {
    pFVar1 = pFVar2->m_Next;
    if ((pFVar2->Flags & flags) != 0) {
      (*pFVar2->_vptr_FBaseCVar[1])();
    }
  }
  return;
}

Assistant:

void DestroyCVarsFlagged (DWORD flags)
{
	FBaseCVar *cvar = CVars;
	FBaseCVar *next = cvar;

	while(cvar)
	{
		next = cvar->m_Next;

		if(cvar->Flags & flags)
			delete cvar;

		cvar = next;
	}
}